

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

APInt __thiscall llvm::detail::IEEEFloat::bitcastToAPInt(IEEEFloat *this)

{
  undefined1 *puVar1;
  long *in_RSI;
  APInt AVar3;
  undefined8 uVar2;
  
  puVar1 = (undefined1 *)*in_RSI;
  if (puVar1 == semIEEEhalf) {
    AVar3 = convertHalfAPFloatToAPInt(this);
    uVar2 = AVar3._8_8_;
  }
  else if (puVar1 == semIEEEsingle) {
    AVar3 = convertFloatAPFloatToAPInt(this);
    uVar2 = AVar3._8_8_;
  }
  else if (puVar1 == semIEEEdouble) {
    AVar3 = convertDoubleAPFloatToAPInt(this);
    uVar2 = AVar3._8_8_;
  }
  else if (puVar1 == semIEEEquad) {
    AVar3 = convertQuadrupleAPFloatToAPInt(this);
    uVar2 = AVar3._8_8_;
  }
  else if (puVar1 == semPPCDoubleDoubleLegacy) {
    AVar3 = convertPPCDoubleDoubleAPFloatToAPInt(this);
    uVar2 = AVar3._8_8_;
  }
  else {
    if (puVar1 != semX87DoubleExtended) {
      __assert_fail("semantics == (const llvm::fltSemantics*)&semX87DoubleExtended && \"unknown format!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xbc7,"APInt llvm::detail::IEEEFloat::bitcastToAPInt() const");
    }
    AVar3 = convertF80LongDoubleAPFloatToAPInt(this);
    uVar2 = AVar3._8_8_;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt IEEEFloat::bitcastToAPInt() const {
  if (semantics == (const llvm::fltSemantics*)&semIEEEhalf)
    return convertHalfAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics*)&semIEEEsingle)
    return convertFloatAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics*)&semIEEEdouble)
    return convertDoubleAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics*)&semIEEEquad)
    return convertQuadrupleAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy)
    return convertPPCDoubleDoubleAPFloatToAPInt();

  assert(semantics == (const llvm::fltSemantics*)&semX87DoubleExtended &&
         "unknown format!");
  return convertF80LongDoubleAPFloatToAPInt();
}